

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O3

void __thiscall
Zip::SignatureError::SignatureError(SignatureError *this,uint32_t expected,uint32_t actual)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  stringstream ss;
  long *local_1c8 [2];
  long local_1b8 [2];
  long local_1a8 [2];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [96];
  char acStack_c8 [168];
  
  *(undefined ***)this = &PTR__SignatureError_00106d50;
  this->expected_ = expected;
  this->actual_ = actual;
  (this->error_)._M_dataplus._M_p = (pointer)&(this->error_).field_2;
  (this->error_)._M_string_length = 0;
  (this->error_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  lVar1 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar1 + 1] == '\0') {
    std::ios::widen((char)local_1c8 + (char)lVar1 + ' ');
    acStack_c8[lVar1 + 1] = '\x01';
  }
  acStack_c8[lVar1] = '0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Expected signature 0x",0x15);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"got signature 0x",0x10);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->error_,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

Zip::SignatureError::SignatureError(uint32_t expected, uint32_t actual)
  : expected_(expected), actual_(actual) {
  std::stringstream ss;
  ss.fill('0');
  ss << "Expected signature 0x"
     << std::hex << std::setw(8) << expected_ << ", "
     << "got signature 0x"
     << std::hex << std::setw(8) << actual_;
  error_ = ss.str();
}